

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cc
# Opt level: O2

uint64_t kratos::eval_bin_op(uint64_t left_value,uint64_t right_value,ExprOp op,uint32_t width,
                            bool signed_)

{
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  ulong uVar4;
  runtime_error *this;
  byte bVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  bVar2 = (byte)width;
  bVar5 = bVar2 - 1;
  bVar9 = left_value >> (bVar5 & 0x3f) != 0;
  bVar7 = bVar9 && signed_;
  bVar10 = right_value >> (bVar5 & 0x3f) != 0;
  bVar8 = bVar10 && signed_;
  uVar3 = left_value;
  if (bVar9 && signed_) {
    uVar3 = (-(-1L << (bVar2 & 0x3f) ^ left_value) << (-bVar2 & 0x3f)) >> (-bVar2 & 0x3f);
  }
  if (bVar10 && signed_) {
    uVar6 = 0xffffffffffffffff >> (-bVar2 & 0x3f);
    uVar4 = -(-1L << (bVar2 & 0x3f) ^ right_value) & uVar6;
  }
  else {
    uVar6 = 0xffffffffffffffff >> (-bVar2 & 0x3f);
    uVar4 = right_value;
  }
  if (0x12 < op - Add) {
switchD_001e76b5_caseD_b:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Not implemented");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = (byte)right_value;
  switch(op) {
  case Add:
    uVar4 = right_value + left_value;
    break;
  case Minus:
    uVar4 = left_value - right_value & uVar6;
    break;
  case Divide:
    uVar4 = uVar3 / uVar4;
    goto LAB_001e7815;
  case Multiply:
    uVar4 = uVar3 * uVar4;
LAB_001e7815:
    if (signed_ && bVar9 != bVar10) {
      uVar4 = -(uVar4 ^ -1L << (bVar2 & 0x3f)) & uVar6;
    }
    break;
  default:
    goto switchD_001e76b5_caseD_b;
  case LogicalShiftRight:
    uVar4 = left_value >> (bVar1 & 0x3f);
    break;
  case SignedShiftRight:
    uVar4 = uVar3 >> (bVar1 & 0x3f);
    if (bVar9 && signed_) {
      uVar4 = uVar4 | -1L << (bVar5 - bVar1 & 0x3f);
    }
    break;
  case Or:
    uVar4 = right_value | left_value;
    break;
  case And:
    uVar4 = right_value & left_value;
    break;
  case Xor:
    uVar4 = right_value ^ left_value;
    break;
  case Power:
    auVar12._8_4_ = (int)(left_value >> 0x20);
    auVar12._0_8_ = left_value;
    auVar12._12_4_ = 0x45300000;
    auVar13._8_4_ = (int)(right_value >> 0x20);
    auVar13._0_8_ = right_value;
    auVar13._12_4_ = 0x45300000;
    dVar11 = pow((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)left_value) - 4503599627370496.0),
                 (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)right_value) - 4503599627370496.0));
    uVar4 = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
    break;
  case LessThan:
    if (!(bool)(~bVar7 & 1) && (!bVar10 || !signed_)) {
LAB_001e77cc:
      uVar4 = 1;
      break;
    }
    if ((bool)(~bVar8 & 1) || bVar9 && signed_) {
      bVar8 = uVar3 < uVar4;
LAB_001e77bf:
      uVar4 = (ulong)(byte)(bVar7 ^ bVar8);
      break;
    }
    goto LAB_001e77c8;
  case GreaterThan:
    if ((bool)(~bVar7 & 1) || bVar10 && signed_) {
      if ((bool)(~bVar8 & 1) || bVar9 && signed_) {
        bVar8 = uVar4 < uVar3;
        goto LAB_001e77bf;
      }
      goto LAB_001e77cc;
    }
    goto LAB_001e77c8;
  case LessEqThan:
    if (!(bool)(~bVar7 & 1) && (!bVar10 || !signed_)) goto LAB_001e77cc;
    if ((bool)(~bVar8 & 1) || bVar9 && signed_) {
      bVar8 = uVar3 <= uVar4;
      goto LAB_001e77bf;
    }
    goto LAB_001e77c8;
  case GreaterEqThan:
    if ((bool)(~bVar7 & 1) || bVar10 && signed_) {
      if ((bool)(~bVar8 & 1) || bVar9 && signed_) {
        bVar8 = uVar4 <= uVar3;
        goto LAB_001e77bf;
      }
      goto LAB_001e77cc;
    }
LAB_001e77c8:
    uVar4 = 0;
    break;
  case Eq:
    uVar4 = (ulong)(left_value == right_value);
  }
  return uVar4 & uVar6;
}

Assistant:

uint64_t eval_bin_op(uint64_t left_value, uint64_t right_value, ExprOp op, uint32_t width,
                     bool signed_) {
    bool left_negative = signed_ && left_value >> (width - 1);
    bool right_negative = signed_ && right_value >> (width - 1);
    uint64_t left_abs_value = left_negative ? two_complement(left_value, width) : left_value;
    uint64_t right_abs_value = right_negative ? two_complement(right_value, width) : right_value;
    uint64_t signed_bit = static_cast<uint64_t>(left_negative ^ right_negative) << (width - 1);
    auto const mask = UINT64_MASK >> (64u - width);
    uint64_t result;
    switch (op) {
        case ExprOp::Add:
            result = left_value + right_value;
            break;
        case ExprOp::Minus:
            result = (left_value - right_value) & mask;
            break;
        case ExprOp::Multiply:
            result = left_abs_value * right_abs_value;
            if (signed_bit) result = two_complement(result, width);
            break;
        case ExprOp::Divide:
            result = left_abs_value / right_abs_value;
            if (signed_bit) result = two_complement(result, width);
            break;
        case ExprOp::And:
            result = left_value & right_value;
            break;
        case ExprOp::Or:
            result = left_value | right_value;
            break;
        case ExprOp::Xor:
            result = left_value ^ right_value;
            break;
        case ExprOp::Eq:
            result = left_value == right_value;
            break;
        case ExprOp::Power:
            result = static_cast<uint64_t>(std::pow(left_value, right_value));
            break;
        case ExprOp::GreaterEqThan:
            result = left_abs_value >= right_abs_value;
            result = (left_negative && !right_negative)
                         ? false
                         : !left_negative && right_negative ? true : result ^ left_negative;
            break;
        case ExprOp::LessEqThan:
            result = left_abs_value <= right_abs_value;
            result = (left_negative && !right_negative)
                         ? true
                         : !left_negative && right_negative ? false : result ^ left_negative;
            break;
        case ExprOp::LessThan:
            result = left_abs_value < right_abs_value;
            result = (left_negative && !right_negative)
                         ? true
                         : !left_negative && right_negative ? false : result ^ left_negative;
            break;
        case ExprOp ::GreaterThan:
            result = left_abs_value > right_abs_value;
            result = (left_negative && !right_negative)
                         ? false
                         : !left_negative && right_negative ? true : result ^ left_negative;
            break;
        case ExprOp::SignedShiftRight:
            result = left_abs_value >> right_value;
            if (left_negative) result |= UINT64_MASK << (width - 1 - right_value);
            break;
        case ExprOp::LogicalShiftRight:
            result = left_value >> right_value;
            break;
        default: {
            throw std::runtime_error("Not implemented");
        }
    }
    result = result & (UINT64_MASK >> (64 - width));
    return result;
}